

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O3

void ctx_modules_undo_backlinks(ly_ctx *ctx,ly_set *mods)

{
  uint uVar1;
  lys_module *plVar2;
  int iVar3;
  lys_feature *plVar4;
  lys_ident *plVar5;
  lys_node *node;
  ly_set *plVar6;
  lys_node *set;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  
  if (4 < (ctx->models).used) {
    lVar8 = 4;
    do {
      plVar2 = (ctx->models).list[lVar8];
      if (plVar2->features_size != '\0') {
        plVar4 = plVar2->features;
        uVar7 = 0;
        do {
          if (plVar4[uVar7].depfeatures != (ly_set *)0x0) {
            plVar6 = plVar4[uVar7].depfeatures;
            if (plVar6->number != 0) {
              uVar10 = 0;
              do {
                uVar9 = (uint)uVar10;
                if (mods == (ly_set *)0x0) {
LAB_00110ccf:
                  ly_set_rm_index(plVar4[uVar7].depfeatures,uVar9);
                  uVar9 = uVar9 - 1;
                }
                else {
                  iVar3 = ly_set_contains(mods,(plVar6->set).s[uVar10]->module);
                  if (iVar3 != -1) {
                    plVar4 = plVar2->features;
                    goto LAB_00110ccf;
                  }
                }
                uVar10 = (ulong)(uVar9 + 1);
                plVar4 = plVar2->features;
                plVar6 = plVar4[uVar7].depfeatures;
              } while (uVar9 + 1 < plVar6->number);
              if (plVar6->number != 0) goto LAB_00110d0b;
            }
            ly_set_free(plVar6);
            plVar4 = plVar2->features;
            plVar4[uVar7].depfeatures = (ly_set *)0x0;
          }
LAB_00110d0b:
          uVar7 = uVar7 + 1;
        } while (uVar7 < plVar2->features_size);
      }
      if (plVar2->ident_size != 0) {
        plVar5 = plVar2->ident;
        uVar7 = 0;
        do {
          if (plVar5[uVar7].der != (ly_set *)0x0) {
            plVar6 = plVar5[uVar7].der;
            if (plVar6->number != 0) {
              uVar10 = 0;
              do {
                uVar9 = (uint)uVar10;
                if (mods == (ly_set *)0x0) {
LAB_00110d72:
                  ly_set_rm_index(plVar5[uVar7].der,uVar9);
                  uVar9 = uVar9 - 1;
                }
                else {
                  iVar3 = ly_set_contains(mods,(plVar6->set).s[uVar10]->module);
                  if (iVar3 != -1) {
                    plVar5 = plVar2->ident;
                    goto LAB_00110d72;
                  }
                }
                uVar10 = (ulong)(uVar9 + 1);
                plVar5 = plVar2->ident;
                plVar6 = plVar5[uVar7].der;
              } while (uVar9 + 1 < plVar6->number);
              if (plVar6->number != 0) goto LAB_00110dae;
            }
            ly_set_free(plVar6);
            plVar5 = plVar2->ident;
            plVar5[uVar7].der = (ly_set *)0x0;
          }
LAB_00110dae:
          uVar7 = uVar7 + 1;
        } while (uVar7 < plVar2->ident_size);
      }
      set = plVar2->data;
      if (plVar2->data != (lys_node *)0x0) {
LAB_00110dd5:
        node = set;
        set = node->child;
        if ((node->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) goto LAB_00110e33;
        if (set != (lys_node *)0x0) {
          if ((mods != (ly_set *)0x0) && (*(int *)((long)&set->name + 4) != 0)) {
            uVar7 = 0;
            do {
              uVar9 = (uint)uVar7;
              iVar3 = ly_set_contains(mods,*(void **)(*(long *)(set->dsc + uVar7 * 8) + 0x30));
              if (iVar3 != -1) {
                ly_set_rm_index((ly_set *)node->child,uVar9);
                uVar9 = uVar9 - 1;
              }
              uVar7 = (ulong)(uVar9 + 1);
              set = node->child;
              uVar1 = *(uint *)((long)&set->name + 4);
            } while (uVar9 + 1 < uVar1);
            if (uVar1 != 0) goto LAB_00110e33;
          }
          ly_set_free((ly_set *)set);
          node->child = (lys_node *)0x0;
        }
        goto LAB_00110e59;
      }
LAB_00110e78:
      lVar8 = lVar8 + 1;
    } while (lVar8 < (ctx->models).used);
  }
  return;
LAB_00110e33:
  if (set == (lys_node *)0x0 || (node->nodetype & 0x882c) != LYS_UNKNOWN) {
LAB_00110e59:
    while (set = node->next, node->next == (lys_node *)0x0) {
      node = lys_parent(node);
      if (node == (lys_node *)0x0) goto LAB_00110e78;
    }
  }
  goto LAB_00110dd5;
}

Assistant:

static void
ctx_modules_undo_backlinks(struct ly_ctx *ctx, struct ly_set *mods)
{
    int o;
    uint8_t j;
    unsigned int u, v;
    struct lys_module *mod;
    struct lys_node *elem, *next;
    struct lys_node_leaf *leaf;

    /* maintain backlinks (start with internal ietf-yang-library which have leafs as possible targets of leafrefs */
    for (o = INTERNAL_MODULES_COUNT - 1; o < ctx->models.used; o++) {
        mod = ctx->models.list[o]; /* shortcut */

        /* 1) features */
        for (j = 0; j < mod->features_size; j++) {
            if (!mod->features[j].depfeatures) {
                continue;
            }
            for (v = 0; v < mod->features[j].depfeatures->number; v++) {
                if (!mods || ly_set_contains(mods, ((struct lys_feature *)mod->features[j].depfeatures->set.g[v])->module) != -1) {
                    /* depending feature is in module to remove */
                    ly_set_rm_index(mod->features[j].depfeatures, v);
                    v--;
                }
            }
            if (!mod->features[j].depfeatures->number) {
                /* all backlinks removed */
                ly_set_free(mod->features[j].depfeatures);
                mod->features[j].depfeatures = NULL;
            }
        }

        /* 2) identities */
        for (u = 0; u < mod->ident_size; u++) {
            if (!mod->ident[u].der) {
                continue;
            }
            for (v = 0; v < mod->ident[u].der->number; v++) {
                if (!mods || ly_set_contains(mods, ((struct lys_ident *)mod->ident[u].der->set.g[v])->module) != -1) {
                    /* derived identity is in module to remove */
                    ly_set_rm_index(mod->ident[u].der, v);
                    v--;
                }
            }
            if (!mod->ident[u].der->number) {
                /* all backlinks removed */
                ly_set_free(mod->ident[u].der);
                mod->ident[u].der = NULL;
            }
        }

        /* 3) leafrefs */
        for (elem = next = mod->data; elem; elem = next) {
            if (elem->nodetype & (LYS_LEAF | LYS_LEAFLIST)) {
                leaf = (struct lys_node_leaf *)elem; /* shortcut */
                if (leaf->backlinks) {
                    if (!mods) {
                        /* remove all backlinks */
                        ly_set_free(leaf->backlinks);
                        leaf->backlinks = NULL;
                    } else {
                        for (v = 0; v < leaf->backlinks->number; v++) {
                            if (ly_set_contains(mods, leaf->backlinks->set.s[v]->module) != -1) {
                                /* derived identity is in module to remove */
                                ly_set_rm_index(leaf->backlinks, v);
                                v--;
                            }
                        }
                        if (!leaf->backlinks->number) {
                            /* all backlinks removed */
                            ly_set_free(leaf->backlinks);
                            leaf->backlinks = NULL;
                        }
                    }
                }
            }

            /* select next element to process */
            next = elem->child;
            /* child exception for leafs, leaflists, anyxml and groupings */
            if (elem->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA | LYS_GROUPING)) {
                next = NULL;
            }
            if (!next) {
                /* no children,  try siblings */
                next = elem->next;
            }
            while (!next) {
                /* parent is already processed, go to its sibling */
                elem = lys_parent(elem);
                if (!elem) {
                    /* we are done, no next element to process */
                    break;
                }
                /* no siblings, go back through parents */
                next = elem->next;
            }
        }
    }
}